

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64func.cpp
# Opt level: O3

Error asmjit::v1_14::a64::FuncInternal::initCallConv
                (CallConv *cc,CallConvId ccId,Environment *environment)

{
  Array<unsigned_char,_4UL> *this;
  Array<unsigned_char,_4UL> *this_00;
  undefined8 in_RAX;
  uchar *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 uStack_38;
  
  cc->_arch = environment->_arch;
  cc->_strategy = (environment->_platformABI == kDarwin) * '\x03';
  uStack_38._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  uStack_38._0_3_ = (uint3)in_RAX;
  uStack_38._0_4_ = (uint)(uint3)uStack_38;
  this = &cc->_saveRestoreRegSize;
  puVar1 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this,(RegGroup *)((long)&uStack_38 + 3));
  *puVar1 = '\b';
  uStack_38._0_3_ = CONCAT12(1,(undefined2)uStack_38);
  puVar1 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this,(RegGroup *)((long)&uStack_38 + 2));
  *puVar1 = '\b';
  uStack_38 = uStack_38 & 0xffffffffffffff;
  this_00 = &cc->_saveRestoreAlignment;
  puVar1 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this_00,(RegGroup *)((long)&uStack_38 + 7));
  *puVar1 = '\x10';
  uStack_38._0_7_ = CONCAT16(1,(undefined6)uStack_38);
  puVar1 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this_00,(RegGroup *)((long)&uStack_38 + 6));
  *puVar1 = '\x10';
  uStack_38._0_6_ = CONCAT15(2,(undefined5)uStack_38);
  puVar1 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this_00,(RegGroup *)((long)&uStack_38 + 5));
  *puVar1 = '\x01';
  uStack_38._0_5_ = CONCAT14(3,(uint)uStack_38);
  puVar1 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this_00,(RegGroup *)((long)&uStack_38 + 4));
  *puVar1 = '\x01';
  *(undefined8 *)(cc->_passedOrder)._data = 0x706050403020100;
  *(undefined8 *)((long)(cc->_passedOrder)._data + 8) = 0xffffffffffffffff;
  (cc->_passedRegs)._data[0] = 0xff;
  (cc->_passedRegs)._data[1] = 0xff;
  *(undefined8 *)((cc->_passedOrder)._data + 1) = 0x706050403020100;
  *(undefined8 *)((long)(cc->_passedOrder)._data + 0x18) = 0xffffffffffffffff;
  cc->_naturalStackAlignment = '\x10';
  if (ccId < 8) {
    cc->_id = kCDecl;
    uVar2 = 0x7ffc0000;
    uVar3 = 0xff00;
  }
  else {
    cc->_id = ccId;
    uStack_38._0_2_ = CONCAT11(1,(undefined1)uStack_38);
    puVar1 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                       (this,(RegGroup *)((long)&uStack_38 + 1));
    *puVar1 = '\x10';
    uVar2 = 0x7ffffff0;
    uVar3 = 0xfffffff0;
  }
  *(ulong *)(cc->_preservedRegs)._data = CONCAT44(uVar3,uVar2);
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE Error initCallConv(CallConv& cc, CallConvId ccId, const Environment& environment) noexcept {
  cc.setArch(environment.arch());
  cc.setStrategy(environment.isDarwin() ? CallConvStrategy::kAArch64Apple : CallConvStrategy::kDefault);

  cc.setSaveRestoreRegSize(RegGroup::kGp, 8);
  cc.setSaveRestoreRegSize(RegGroup::kVec, 8);
  cc.setSaveRestoreAlignment(RegGroup::kGp, 16);
  cc.setSaveRestoreAlignment(RegGroup::kVec, 16);
  cc.setSaveRestoreAlignment(RegGroup::kMask, 1);
  cc.setSaveRestoreAlignment(RegGroup::kExtraVirt3, 1);
  cc.setPassedOrder(RegGroup::kGp, 0, 1, 2, 3, 4, 5, 6, 7);
  cc.setPassedOrder(RegGroup::kVec, 0, 1, 2, 3, 4, 5, 6, 7);
  cc.setNaturalStackAlignment(16);

  if (shouldTreatAsCDecl(ccId)) {
    // ARM doesn't have that many calling conventions as we can find in X86 world, treat most conventions as __cdecl.
    cc.setId(CallConvId::kCDecl);
    cc.setPreservedRegs(RegGroup::kGp, Support::bitMask(Gp::kIdOs, 19, 20, 21, 22, 23, 24, 25, 26, 27, 28, 29, 30));
    cc.setPreservedRegs(RegGroup::kVec, Support::bitMask(8, 9, 10, 11, 12, 13, 14, 15));
  }
  else {
    cc.setId(ccId);
    cc.setSaveRestoreRegSize(RegGroup::kVec, 16);
    cc.setPreservedRegs(RegGroup::kGp, Support::bitMask(4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16, 17, 18, 19, 20, 21, 22, 23, 24, 25, 26, 27, 28, 29, 30));
    cc.setPreservedRegs(RegGroup::kVec, Support::bitMask(4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16, 17, 18, 19, 20, 21, 22, 23, 24, 25, 26, 27, 28, 29, 30, 31));
  }

  return kErrorOk;
}